

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int exhaustive_mesh_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int range,int step,
              FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  int iVar1;
  uint8_t *puVar2;
  int in_ECX;
  uint in_EDX;
  MV_COST_PARAMS *in_RSI;
  undefined4 in_EDI;
  undefined4 *in_R8;
  MV_COST_PARAMS *in_R9;
  uint sad_1;
  FULLPEL_MV mv_3;
  FULLPEL_MV mv_2;
  FULLPEL_MV mv_1;
  uint8_t *addrs [4];
  uint sads [4];
  uint sad;
  FULLPEL_MV mv;
  int col_step;
  int end_row;
  int start_row;
  int end_col;
  int start_col;
  int i;
  int c;
  int r;
  uint best_sad;
  int ref_stride;
  buf_2d *ref;
  buf_2d *src;
  MV_COST_PARAMS *mv_cost_params;
  MV_COST_PARAMS *in_stack_fffffffffffffef8;
  MV_COST_PARAMS *in_stack_ffffffffffffff00;
  buf_2d *in_stack_ffffffffffffff08;
  MV_COST_PARAMS *in_stack_ffffffffffffff10;
  buf_2d *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint this_sad;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar3;
  int local_d8;
  int local_d4;
  MV_COST_PARAMS *second_best_mv_00;
  int local_bc;
  undefined8 local_a8 [4];
  uint local_88 [6];
  int local_70;
  short local_6c;
  short local_6a;
  int local_68;
  uint local_64;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint local_48;
  int local_44;
  int *local_40;
  buf_2d *local_38;
  FULLPEL_MV *local_30;
  MV_COST_PARAMS *local_28;
  undefined4 *local_20;
  int local_18;
  uint local_14;
  MV_COST_PARAMS *local_10;
  undefined4 local_4;
  
  local_30 = &in_RSI[3].full_ref_mv;
  local_38 = (buf_2d *)in_RSI->mvcost[0];
  local_40 = in_RSI->mvjcost;
  local_44 = local_40[6];
  local_48 = 0x7fffffff;
  local_bc = in_ECX;
  if (in_ECX < 2) {
    local_bc = 4;
  }
  local_68 = local_bc;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  clamp_fullmv((FULLPEL_MV *)in_stack_ffffffffffffff00,(FullMvLimits *)in_stack_fffffffffffffef8);
  *local_20 = local_4;
  second_best_mv_00 = local_10;
  get_buf_from_fullmv((buf_2d *)in_stack_ffffffffffffff00,(FULLPEL_MV *)in_stack_fffffffffffffef8);
  local_48 = get_mvpred_sad((FULLPEL_MOTION_SEARCH_PARAMS *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18,(uint8_t *)in_stack_ffffffffffffff10,
                            (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  iVar1 = mvsad_err_cost_((FULLPEL_MV *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_48 = iVar1 + local_48;
  if (*(int *)&local_10[2].ref_mv - (int)(short)local_4 < (int)-local_14) {
    local_d4 = -local_14;
  }
  else {
    local_d4 = *(int *)&local_10[2].ref_mv - (int)(short)local_4;
  }
  local_60 = local_d4;
  if (local_10[1].error_per_bit - (int)local_4._2_2_ < (int)-local_14) {
    local_d8 = -local_14;
  }
  else {
    local_d8 = local_10[1].error_per_bit - (int)local_4._2_2_;
  }
  local_58 = local_d8;
  uVar3 = local_14;
  if (*(int *)((long)&local_10[2].ref_mv + 4) - (int)(short)local_4 <= (int)local_14) {
    uVar3 = *(int *)((long)&local_10[2].ref_mv + 4) - (int)(short)local_4;
  }
  this_sad = local_14;
  if (local_10[1].sad_per_bit - (int)local_4._2_2_ <= (int)local_14) {
    this_sad = local_10[1].sad_per_bit - (int)local_4._2_2_;
  }
  local_64 = uVar3;
  local_5c = this_sad;
  for (local_4c = local_d4; local_4c <= (int)local_64; local_4c = local_18 + local_4c) {
    for (local_50 = local_58; local_50 <= (int)local_5c; local_50 = local_68 + local_50) {
      if (local_18 < 2) {
        if ((int)local_5c < local_50 + 3) {
          for (local_54 = 0; local_54 < (int)(local_5c - local_50); local_54 = local_54 + 1) {
            in_stack_ffffffffffffff00 = local_10;
            in_stack_ffffffffffffff08 = local_38;
            get_buf_from_fullmv((buf_2d *)local_10,(FULLPEL_MV *)in_stack_fffffffffffffef8);
            get_mvpred_sad((FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(uVar3,this_sad),
                           in_stack_ffffffffffffff18,(uint8_t *)in_stack_ffffffffffffff10,
                           (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
            in_stack_fffffffffffffef8 = local_28;
            update_mvs_and_sad(this_sad,(FULLPEL_MV *)in_stack_ffffffffffffff18,
                               in_stack_ffffffffffffff10,(uint *)in_stack_ffffffffffffff08,
                               (uint *)in_stack_ffffffffffffff00,(FULLPEL_MV *)local_28,
                               (FULLPEL_MV *)second_best_mv_00);
          }
        }
        else {
          for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
            puVar2 = get_buf_from_fullmv((buf_2d *)in_stack_ffffffffffffff00,
                                         (FULLPEL_MV *)in_stack_fffffffffffffef8);
            local_a8[local_54] = puVar2;
          }
          (*(code *)local_10[4].mvjcost)(local_38->buf,local_38->stride,local_a8,local_44,local_88);
          for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
            if (local_88[local_54] < local_48) {
              in_stack_fffffffffffffef8 = local_28;
              update_mvs_and_sad(this_sad,(FULLPEL_MV *)in_stack_ffffffffffffff18,
                                 in_stack_ffffffffffffff10,(uint *)in_stack_ffffffffffffff08,
                                 (uint *)in_stack_ffffffffffffff00,(FULLPEL_MV *)local_28,
                                 (FULLPEL_MV *)second_best_mv_00);
            }
          }
        }
      }
      else {
        local_6c = (short)local_4 + (short)local_4c;
        local_6a = local_4._2_2_ + (short)local_50;
        in_stack_ffffffffffffff10 = local_10;
        in_stack_ffffffffffffff18 = local_38;
        get_buf_from_fullmv((buf_2d *)in_stack_ffffffffffffff00,
                            (FULLPEL_MV *)in_stack_fffffffffffffef8);
        local_70 = get_mvpred_sad((FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(uVar3,this_sad),
                                  in_stack_ffffffffffffff18,(uint8_t *)in_stack_ffffffffffffff10,
                                  (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        in_stack_fffffffffffffef8 = local_28;
        update_mvs_and_sad(this_sad,(FULLPEL_MV *)in_stack_ffffffffffffff18,
                           in_stack_ffffffffffffff10,(uint *)in_stack_ffffffffffffff08,
                           (uint *)in_stack_ffffffffffffff00,(FULLPEL_MV *)local_28,
                           (FULLPEL_MV *)second_best_mv_00);
      }
    }
  }
  return local_48;
}

Assistant:

static int exhaustive_mesh_search(FULLPEL_MV start_mv,
                                  const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                                  const int range, const int step,
                                  FULLPEL_MV *best_mv,
                                  FULLPEL_MV *second_best_mv) {
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const int ref_stride = ref->stride;
  unsigned int best_sad = INT_MAX;
  int r, c, i;
  int start_col, end_col, start_row, end_row;
  const int col_step = (step > 1) ? step : 4;

  assert(step >= 1);

  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  *best_mv = start_mv;
  best_sad = get_mvpred_sad(ms_params, src, get_buf_from_fullmv(ref, &start_mv),
                            ref_stride);
  best_sad += mvsad_err_cost_(&start_mv, mv_cost_params);
  start_row = AOMMAX(-range, ms_params->mv_limits.row_min - start_mv.row);
  start_col = AOMMAX(-range, ms_params->mv_limits.col_min - start_mv.col);
  end_row = AOMMIN(range, ms_params->mv_limits.row_max - start_mv.row);
  end_col = AOMMIN(range, ms_params->mv_limits.col_max - start_mv.col);

  for (r = start_row; r <= end_row; r += step) {
    for (c = start_col; c <= end_col; c += col_step) {
      // Step > 1 means we are not checking every location in this pass.
      if (step > 1) {
        const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c };
        unsigned int sad = get_mvpred_sad(
            ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
        update_mvs_and_sad(sad, &mv, mv_cost_params, &best_sad,
                           /*raw_best_sad=*/NULL, best_mv, second_best_mv);
      } else {
        // 4 sads in a single call if we are checking every location
        if (c + 3 <= end_col) {
          unsigned int sads[4];
          const uint8_t *addrs[4];
          for (i = 0; i < 4; ++i) {
            const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
            addrs[i] = get_buf_from_fullmv(ref, &mv);
          }

          ms_params->sdx4df(src->buf, src->stride, addrs, ref_stride, sads);

          for (i = 0; i < 4; ++i) {
            if (sads[i] < best_sad) {
              const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
              update_mvs_and_sad(sads[i], &mv, mv_cost_params, &best_sad,
                                 /*raw_best_sad=*/NULL, best_mv,
                                 second_best_mv);
            }
          }
        } else {
          for (i = 0; i < end_col - c; ++i) {
            const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
            unsigned int sad = get_mvpred_sad(
                ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
            update_mvs_and_sad(sad, &mv, mv_cost_params, &best_sad,
                               /*raw_best_sad=*/NULL, best_mv, second_best_mv);
          }
        }
      }
    }
  }

  return best_sad;
}